

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void whitespace_suite::test_newlines(void)

{
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [3];
  
  decoder.current.scan._261_2_ = 0xa0a;
  decoder.current.scan._263_1_ = 0;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<3ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [3])((long)&decoder.current.scan + 0x105));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0xb6,"void whitespace_suite::test_newlines()",local_148,&local_14c);
  return;
}

Assistant:

void test_newlines()
{
    const char input[] = "\n\n";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}